

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsstyle.cpp
# Opt level: O3

void __thiscall QWindowsStyle::polish(QWindowsStyle *this,QApplication *app)

{
  undefined2 uVar1;
  undefined4 uVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  int iVar6;
  QStyle *this_00;
  QStyle *pQVar7;
  long *plVar8;
  ColorGroup CVar9;
  long in_FS_OFFSET;
  QPalette local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QCommonStyle::polish(&this->super_QCommonStyle,app);
  lVar3 = *(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8;
  pQVar7 = QStyle::proxy(this_00);
  iVar6 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x29,0,0,0);
  if ((app != (QApplication *)0x0) && (iVar6 == 0)) {
    QObject::installEventFilter((QObject *)app);
  }
  QGuiApplication::palette();
  CVar9 = (ColorGroup)&local_30;
  plVar8 = (long *)QPalette::brush(CVar9,Dark);
  lVar4 = *plVar8;
  uVar5 = *(undefined8 *)(lVar4 + 0xe);
  *(undefined8 *)(lVar3 + 0x128) = *(undefined8 *)(lVar4 + 8);
  *(undefined8 *)(lVar3 + 0x12e) = uVar5;
  uVar2 = *(undefined4 *)(lVar4 + 0x10);
  uVar1 = *(undefined2 *)(lVar4 + 0x14);
  *(undefined8 *)(lVar3 + 0x118) = *(undefined8 *)(lVar4 + 8);
  *(undefined2 *)(lVar3 + 0x124) = uVar1;
  *(undefined4 *)(lVar3 + 0x120) = uVar2;
  plVar8 = (long *)QPalette::brush(CVar9,Dark);
  lVar4 = *plVar8;
  uVar5 = *(undefined8 *)(lVar4 + 0xe);
  *(undefined8 *)(lVar3 + 0x148) = *(undefined8 *)(lVar4 + 8);
  *(undefined8 *)(lVar3 + 0x14e) = uVar5;
  uVar2 = *(undefined4 *)(lVar4 + 0x10);
  uVar1 = *(undefined2 *)(lVar4 + 0x14);
  *(undefined8 *)(lVar3 + 0x138) = *(undefined8 *)(lVar4 + 8);
  *(undefined2 *)(lVar3 + 0x144) = uVar1;
  *(undefined4 *)(lVar3 + 0x140) = uVar2;
  plVar8 = (long *)QPalette::brush(CVar9,Dark);
  uVar5 = *(undefined8 *)(*plVar8 + 0xe);
  *(undefined8 *)(lVar3 + 0x108) = *(undefined8 *)(*plVar8 + 8);
  *(undefined8 *)(lVar3 + 0x10e) = uVar5;
  QPalette::~QPalette(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWindowsStyle::polish(QApplication *app)
{
    QCommonStyle::polish(app);
    QWindowsStylePrivate *d = const_cast<QWindowsStylePrivate*>(d_func());
    // We only need the overhead when shortcuts are sometimes hidden
    if (!proxy()->styleHint(SH_UnderlineShortcut, nullptr) && app)
        app->installEventFilter(this);

    const auto &palette = QGuiApplication::palette();
    d->activeGradientCaptionColor = palette.highlight().color();
    d->activeCaptionColor = d->activeGradientCaptionColor;
    d->inactiveGradientCaptionColor = palette.dark().color();
    d->inactiveCaptionColor = d->inactiveGradientCaptionColor;
    d->inactiveCaptionText = palette.window().color();

#if defined(Q_OS_WIN) //fetch native title bar colors
    if (app->desktopSettingsAware()){
        DWORD activeCaption = GetSysColor(COLOR_ACTIVECAPTION);
        DWORD gradientActiveCaption = GetSysColor(COLOR_GRADIENTACTIVECAPTION);
        DWORD inactiveCaption = GetSysColor(COLOR_INACTIVECAPTION);
        DWORD gradientInactiveCaption = GetSysColor(COLOR_GRADIENTINACTIVECAPTION);
        DWORD inactiveCaptionText = GetSysColor(COLOR_INACTIVECAPTIONTEXT);
        d->activeCaptionColor = colorref2qrgb(activeCaption);
        d->activeGradientCaptionColor = colorref2qrgb(gradientActiveCaption);
        d->inactiveCaptionColor = colorref2qrgb(inactiveCaption);
        d->inactiveGradientCaptionColor = colorref2qrgb(gradientInactiveCaption);
        d->inactiveCaptionText = colorref2qrgb(inactiveCaptionText);
    }
#endif
}